

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::CreateTar
               (char *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,cmTarCompression compressType,bool verbose,string *mtime,string *format)

{
  int c;
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  ulong uVar4;
  reference pbVar5;
  string local_458;
  string local_438;
  string local_418;
  undefined1 local_3f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_3b8 [5];
  bool tarCreatedSuccessfully;
  undefined1 local_398 [8];
  cmArchiveWrite a;
  Compress compress;
  allocator<char> local_289;
  undefined1 local_288 [8];
  string e;
  undefined1 local_258 [8];
  ofstream fout;
  string cwd;
  string *format_local;
  string *mtime_local;
  bool verbose_local;
  cmTarCompression compressType_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  char *outFileName_local;
  
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&fout.field_0x1f8,(SystemTools *)0x1,SUB41(compressType,0));
  _Var3 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(local_258,outFileName,_Var3);
  bVar1 = std::ios::operator!((ios *)(local_258 + (long)*(_func_int **)((long)local_258 + -0x18)));
  if ((bVar1 & 1) == 0) {
    a.PermissionsMask.Value = 0;
    switch(compressType) {
    case TarCompressGZip:
      a.PermissionsMask.Value = 2;
      break;
    case TarCompressBZip2:
      a.PermissionsMask.Value = 3;
      break;
    case TarCompressXZ:
      a.PermissionsMask.Value = 5;
      break;
    case TarCompressNone:
      a.PermissionsMask.Value = 0;
    }
    c = a.PermissionsMask.Value;
    uVar4 = std::__cxx11::string::empty();
    __range1._6_1_ = 0;
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::string((string *)local_3b8,(string *)format);
    }
    else {
      std::allocator<char>::allocator();
      __range1._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3b8,"paxr",(allocator<char> *)((long)&__range1 + 7));
    }
    cmArchiveWrite::cmArchiveWrite
              ((cmArchiveWrite *)local_398,(ostream *)local_258,c,(string *)local_3b8);
    std::__cxx11::string::~string((string *)local_3b8);
    if ((__range1._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    }
    cmArchiveWrite::SetMTime((cmArchiveWrite *)local_398,mtime);
    cmArchiveWrite::SetVerbose((cmArchiveWrite *)local_398,verbose);
    __range1._5_1_ = 1;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(files);
    path.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(files);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&path.field_2 + 8)), bVar2) {
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      std::__cxx11::string::string((string *)local_3f8,(string *)pbVar5);
      bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_3f8);
      if (bVar2) {
        RelativePath(&local_418,(string *)&fout.field_0x1f8,(string *)local_3f8);
        std::__cxx11::string::operator=((string *)local_3f8,(string *)&local_418);
        std::__cxx11::string::~string((string *)&local_418);
      }
      std::__cxx11::string::string((string *)&local_438,(string *)local_3f8);
      bVar2 = cmArchiveWrite::Add((cmArchiveWrite *)local_398,&local_438,0,(char *)0x0,true);
      std::__cxx11::string::~string((string *)&local_438);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        cmArchiveWrite::GetError_abi_cxx11_(&local_458,(cmArchiveWrite *)local_398);
        Error(&local_458);
        std::__cxx11::string::~string((string *)&local_458);
        __range1._5_1_ = 0;
      }
      std::__cxx11::string::~string((string *)local_3f8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    outFileName_local._7_1_ = (bool)(__range1._5_1_ & 1);
    a.PermissionsMask.IsValueSet = true;
    a.PermissionsMask._5_3_ = 0;
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_398);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_288,"Cannot open output file \"",&local_289);
    std::allocator<char>::~allocator(&local_289);
    std::__cxx11::string::operator+=((string *)local_288,outFileName);
    std::__cxx11::string::operator+=((string *)local_288,"\": ");
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::string::operator+=((string *)local_288,(string *)&compress);
    std::__cxx11::string::~string((string *)&compress);
    Error((string *)local_288);
    outFileName_local._7_1_ = false;
    a.PermissionsMask.IsValueSet = true;
    a.PermissionsMask._5_3_ = 0;
    std::__cxx11::string::~string((string *)local_288);
  }
  std::ofstream::~ofstream(local_258);
  std::__cxx11::string::~string((string *)&fout.field_0x1f8);
  return outFileName_local._7_1_;
}

Assistant:

bool cmSystemTools::CreateTar(const char* outFileName,
                              const std::vector<std::string>& files,
                              cmTarCompression compressType, bool verbose,
                              std::string const& mtime,
                              std::string const& format)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  cmsys::ofstream fout(outFileName, std::ios::out | std::ios::binary);
  if (!fout) {
    std::string e = "Cannot open output file \"";
    e += outFileName;
    e += "\": ";
    e += cmSystemTools::GetLastSystemError();
    cmSystemTools::Error(e);
    return false;
  }
  cmArchiveWrite::Compress compress = cmArchiveWrite::CompressNone;
  switch (compressType) {
    case TarCompressGZip:
      compress = cmArchiveWrite::CompressGZip;
      break;
    case TarCompressBZip2:
      compress = cmArchiveWrite::CompressBZip2;
      break;
    case TarCompressXZ:
      compress = cmArchiveWrite::CompressXZ;
      break;
    case TarCompressNone:
      compress = cmArchiveWrite::CompressNone;
      break;
  }

  cmArchiveWrite a(fout, compress, format.empty() ? "paxr" : format);

  a.SetMTime(mtime);
  a.SetVerbose(verbose);
  bool tarCreatedSuccessfully = true;
  for (auto path : files) {
    if (cmSystemTools::FileIsFullPath(path)) {
      // Get the relative path to the file.
      path = cmSystemTools::RelativePath(cwd, path);
    }
    if (!a.Add(path)) {
      cmSystemTools::Error(a.GetError());
      tarCreatedSuccessfully = false;
    }
  }
  return tarCreatedSuccessfully;
#else
  (void)outFileName;
  (void)files;
  (void)verbose;
  return false;
#endif
}